

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_ctor_copy_assign(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2cd,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2ce,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2cf,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d0,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d2,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d3,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d4,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d5,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d7,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d8,"void api_fixed_suite::fixed_ctor_copy_assign()",true);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2d9,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2da,"void api_fixed_suite::fixed_ctor_copy_assign()",&local_40,&local_34);
  return;
}

Assistant:

void fixed_ctor_copy_assign()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
    circular_view<int, 4> clone;
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
    clone = span;
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
}